

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O3

bool __thiscall ResourceDirWrapper::wrap(ResourceDirWrapper *this)

{
  WORD WVar1;
  int iVar2;
  ResourceEntryWrapper *pRVar3;
  ResourceEntryWrapper *this_00;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  ResourceEntryWrapper *pRVar5;
  ResourceEntryWrapper *topEntryId;
  ResourceEntryWrapper *local_40;
  IMAGE_RESOURCE_DIRECTORY *local_38;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  if ((this->topEntryID == -1) && (this->album != (ResourcesAlbum *)0x0)) {
    ResourcesAlbum::clear(this->album);
  }
  local_38 = resourceDir(this);
  if ((local_38 != (IMAGE_RESOURCE_DIRECTORY *)0x0) &&
     (pRVar3 = (ResourceEntryWrapper *)
               ((ulong)local_38->NumberOfIdEntries + (ulong)local_38->NumberOfNamedEntries),
     pRVar3 != (ResourceEntryWrapper *)0x0)) {
    pRVar5 = (ResourceEntryWrapper *)0x32;
    if (pRVar3 < (ResourceEntryWrapper *)0x32) {
      pRVar5 = pRVar3;
    }
    pRVar3 = (ResourceEntryWrapper *)0x0;
    do {
      topEntryId = (ResourceEntryWrapper *)this->topEntryID;
      if ((ResourceEntryWrapper *)this->topEntryID == (ResourceEntryWrapper *)0xffffffffffffffff) {
        topEntryId = pRVar3;
      }
      this_00 = (ResourceEntryWrapper *)operator_new(0x70);
      ResourceEntryWrapper::ResourceEntryWrapper
                (this_00,(this->super_DataDirEntryWrapper).super_PENodeWrapper.m_PE,this,
                 (size_t)pRVar3,(long)topEntryId,this->album);
      iVar2 = (*(this_00->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this_00);
      if (CONCAT44(extraout_var,iVar2) == 0) {
        (*(this_00->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
          super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])(this_00);
        break;
      }
      if ((this->topEntryID == -1) && (this->album != (ResourcesAlbum *)0x0)) {
        WVar1 = ResourceEntryWrapper::getID(this_00);
        local_40 = pRVar3;
        pmVar4 = std::
                 map<long,_pe::resource_type,_std::less<long>,_std::allocator<std::pair<const_long,_pe::resource_type>_>_>
                 ::operator[](&this->album->idToLeafType,(key_type_conflict *)&local_40);
        *pmVar4 = (uint)WVar1;
      }
      local_40 = this_00;
      std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                ((vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                 &(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries
                 ,(ExeNodeWrapper **)&local_40);
      pRVar3 = (ResourceEntryWrapper *)
               ((long)&(pRVar3->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                       super_AbstractByteBuffer._vptr_AbstractByteBuffer + 1);
    } while (pRVar5 != pRVar3);
  }
  return local_38 != (IMAGE_RESOURCE_DIRECTORY *)0x0;
}

Assistant:

bool ResourceDirWrapper::wrap()
{
    clear();
    if (this->topEntryID == TOP_ENTRY_ROOT && this->album != NULL) {
        this->album->clear();
    }
    IMAGE_RESOURCE_DIRECTORY* dir = resourceDir();
    if (dir == NULL) return false;
    size_t namesNum = dir->NumberOfNamedEntries;
    size_t idsNum = dir->NumberOfIdEntries;

    size_t totalEntries = namesNum + idsNum;
    for (size_t i = 0; i < totalEntries && i < MAX_ENTRIES; i++ ) {

        long topDirId = (this->topEntryID != TOP_ENTRY_ROOT) ? this->topEntryID : long(i) ;

        //ResourceEntryWrapper(PEFile *pe, ResourceDirWrapper *parentDir, size_t entryNumber, long topEntryId, ResourcesAlbum *resAlbum)
        ResourceEntryWrapper* entry = new ResourceEntryWrapper(this->m_PE, this, i, topDirId, this->album);

        if (entry->getPtr() == NULL) {
            delete entry;
            break;
        }
        if (this->topEntryID == TOP_ENTRY_ROOT && this->album != NULL) {
            pe::resource_type typeId = static_cast<pe::resource_type>(entry->getID());
            this->album->mapIdToLeafType(i, typeId);
        }
        //this->parsedSize += val;
        this->entries.push_back(entry);
    }
    //printf("Entries: %d\n", getEntriesCount());
    return true;
}